

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIImage.cpp
# Opt level: O3

void __thiscall irr::gui::CGUIImage::draw(CGUIImage *this)

{
  ITexture *pIVar1;
  dimension2d<unsigned_int> dVar2;
  char cVar3;
  long *plVar4;
  long *plVar5;
  uint uVar6;
  uint uVar7;
  undefined8 *puVar8;
  rect<int> clippingRect_2;
  rect<int> clippingRect_1;
  rect<int> clippingRect;
  rect<int> local_58;
  rect<int> local_48;
  rect<int> local_38;
  
  if (this->field_0xa0 != '\x01') {
    return;
  }
  plVar4 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
  plVar5 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x30))();
  pIVar1 = this->Texture;
  if (pIVar1 == (ITexture *)0x0) {
    if (this->DrawBackground == true) {
      local_58.UpperLeftCorner.X = *(int *)&this->field_0x50;
      local_58.UpperLeftCorner.Y = *(int *)&this->field_0x54;
      local_58.LowerRightCorner.X = *(uint *)&this->field_0x58;
      local_58.LowerRightCorner.Y = *(uint *)&this->field_0x5c;
      checkBounds(this,&local_58);
      local_48.UpperLeftCorner.X = (**(code **)*plVar4)(plVar4,0);
      (**(code **)(*plVar4 + 0xa8))(plVar4,this,&local_48,&this->field_0x40,&local_58);
    }
    goto LAB_0021ebb9;
  }
  local_58.UpperLeftCorner = (this->SourceRect).UpperLeftCorner;
  dVar2.Width = (this->SourceRect).LowerRightCorner.X;
  dVar2.Height = (this->SourceRect).LowerRightCorner.Y;
  if (dVar2.Width == local_58.UpperLeftCorner.X) {
LAB_0021ea73:
    dVar2.Width = (pIVar1->OriginalSize).Width;
    dVar2.Height = (pIVar1->OriginalSize).Height;
    local_58.LowerRightCorner = *(vector2d<int> *)&pIVar1->OriginalSize;
    local_58.UpperLeftCorner.X = 0;
    local_58.UpperLeftCorner.Y = 0;
    uVar7 = 0;
    uVar6 = 0;
  }
  else {
    uVar6 = local_58.UpperLeftCorner.X;
    uVar7 = local_58.UpperLeftCorner.Y;
    local_58.LowerRightCorner = (vector2d<int>)dVar2;
    if (dVar2.Height == local_58.UpperLeftCorner.Y) goto LAB_0021ea73;
  }
  if (this->ScaleImage == true) {
    local_48.LowerRightCorner.X = (this->Color).color;
    local_48.UpperLeftCorner.Y = local_48.LowerRightCorner.X;
    local_48.UpperLeftCorner.X = local_48.LowerRightCorner.X;
    local_38.UpperLeftCorner.X = *(int *)&this->field_0x50;
    local_38.UpperLeftCorner.Y = *(int *)&this->field_0x54;
    local_38.LowerRightCorner.X = *(int *)&this->field_0x58;
    local_38.LowerRightCorner.Y = *(int *)&this->field_0x5c;
    local_48.LowerRightCorner.Y = local_48.LowerRightCorner.X;
    checkBounds(this,&local_38);
    (**(code **)(*plVar5 + 400))
              (plVar5,this->Texture,&this->field_0x40,&local_58,&local_38,&local_48,
               this->UseAlphaChannel);
  }
  else {
    local_48.UpperLeftCorner.X = *(int *)&this->field_0x40;
    local_48.UpperLeftCorner.Y = *(int *)&this->field_0x44;
    local_48.LowerRightCorner.X = (dVar2.Width - uVar6) + local_48.UpperLeftCorner.X;
    local_48.LowerRightCorner.Y = local_48.UpperLeftCorner.Y + (dVar2.Height - uVar7);
    checkBounds(this,&local_48);
    core::rect<int>::clipAgainst(&local_48,(rect<int> *)&this->field_0x50);
    (**(code **)(*plVar5 + 0x180))
              (plVar5,this->Texture,&this->field_0x40,&local_58,&local_48,(this->Color).color,
               this->UseAlphaChannel);
  }
LAB_0021ebb9:
  cVar3 = (**(code **)(*(long *)this + 0x68))(this);
  if (cVar3 != '\0') {
    for (puVar8 = *(undefined8 **)&this->field_0x8; puVar8 != (undefined8 *)&this->field_0x8;
        puVar8 = (undefined8 *)*puVar8) {
      (**(code **)(*(long *)puVar8[2] + 0x50))();
    }
  }
  return;
}

Assistant:

void CGUIImage::draw()
{
	if (!IsVisible)
		return;

	IGUISkin *skin = Environment->getSkin();
	video::IVideoDriver *driver = Environment->getVideoDriver();

	if (Texture) {
		core::rect<s32> sourceRect(SourceRect);
		if (sourceRect.getWidth() == 0 || sourceRect.getHeight() == 0) {
			sourceRect = core::rect<s32>(core::dimension2di(Texture->getOriginalSize()));
		}

		if (ScaleImage) {
			const video::SColor Colors[] = {Color, Color, Color, Color};

			core::rect<s32> clippingRect(AbsoluteClippingRect);
			checkBounds(clippingRect);

			driver->draw2DImage(Texture, AbsoluteRect, sourceRect,
					&clippingRect, Colors, UseAlphaChannel);
		} else {
			core::rect<s32> clippingRect(AbsoluteRect.UpperLeftCorner, sourceRect.getSize());
			checkBounds(clippingRect);
			clippingRect.clipAgainst(AbsoluteClippingRect);

			driver->draw2DImage(Texture, AbsoluteRect.UpperLeftCorner, sourceRect,
					&clippingRect, Color, UseAlphaChannel);
		}
	} else if (DrawBackground) {
		core::rect<s32> clippingRect(AbsoluteClippingRect);
		checkBounds(clippingRect);

		skin->draw2DRectangle(this, skin->getColor(EGDC_3D_DARK_SHADOW), AbsoluteRect, &clippingRect);
	}

	IGUIElement::draw();
}